

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O0

bool __thiscall
llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::erase
          (StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this,StringRef Key)

{
  bool bVar1;
  StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_48;
  char *local_40;
  size_t local_38;
  StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_30;
  iterator I;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this_local;
  StringRef Key_local;
  
  local_38 = Key.Length;
  local_40 = Key.Data;
  I.
  super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
          )(StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
            )this;
  local_30.Ptr = (StringMapEntryBase **)find(this,Key);
  local_48.Ptr = (StringMapEntryBase **)end(this);
  bVar1 = StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
          ::operator==(&local_30,(StringMapIterator<llvm::cl::Option_*> *)&local_48);
  if (!bVar1) {
    erase(this,(iterator)local_30.Ptr);
  }
  Key_local.Length._7_1_ = !bVar1;
  return Key_local.Length._7_1_;
}

Assistant:

bool erase(StringRef Key) {
    iterator I = find(Key);
    if (I == end()) return false;
    erase(I);
    return true;
  }